

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler_ir2.hpp
# Opt level: O1

string * decompile_data_abi_cxx11_
                   (string *__return_storage_ptr__,DecompiledVar *v,DecompilerIR2 *param_2)

{
  bool bVar1;
  char cVar2;
  char cVar3;
  runtime_error *this;
  uint uVar4;
  uint uVar5;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (TextLabel16 < v->type) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,
               "Unreachable code reached at /workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/decompiler_ir2.hpp(228)."
              );
    *(undefined ***)this = &PTR__runtime_error_002195e8;
    __cxa_throw(this,&unreachable_exception::typeinfo,std::runtime_error::~runtime_error);
  }
  if (v->global == true) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    uVar5 = v->offset;
    cVar3 = '\x01';
    if (9 < uVar5) {
      uVar4 = uVar5;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (uVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_0019251c;
        }
        if (uVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_0019251c;
        }
        if (uVar4 < 10000) goto LAB_0019251c;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_0019251c:
    local_48 = local_38;
    std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,local_40,uVar5);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
  }
  else {
    uVar5 = v->offset >> 2;
    cVar3 = '\x01';
    if (0x27 < v->offset) {
      uVar4 = uVar5;
      cVar2 = '\x04';
      do {
        cVar3 = cVar2;
        if (uVar4 < 100) {
          cVar3 = cVar3 + -2;
          goto LAB_001924b5;
        }
        if (uVar4 < 1000) {
          cVar3 = cVar3 + -1;
          goto LAB_001924b5;
        }
        if (uVar4 < 10000) goto LAB_001924b5;
        bVar1 = 99999 < uVar4;
        uVar4 = uVar4 / 10000;
        cVar2 = cVar3 + '\x04';
      } while (bVar1);
      cVar3 = cVar3 + '\x01';
    }
LAB_001924b5:
    local_48 = local_38;
    std::__cxx11::string::_M_construct((ulong)&local_48,cVar3);
    std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_48,local_40,uVar5);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48);
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string decompile_data(const DecompiledVar& v, DecompilerIR2&)
{
    std::string output;

    auto type_cstr = v.type == VarType::Int? "" :
                     v.type == VarType::Float? "" :
                     v.type == VarType::TextLabel? "s" :
                     v.type == VarType::TextLabel16? "v" :
                     Unreachable();

    if(v.global)
    {
        output += type_cstr;
        output.push_back('&');
        output.append(std::to_string(v.offset));
    }
    else
    {
        output.append(std::to_string(v.offset / 4));
        output.push_back('@');
        output += type_cstr;
    }

    return output;
}